

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

bool __thiscall QStyleSheetStyle::initObject(QStyleSheetStyle *this,QObject *obj)

{
  long lVar1;
  bool bVar2;
  QWidget *pQVar3;
  long in_RSI;
  long in_FS_OFFSET;
  undefined1 unaff_retaddr;
  WidgetAttribute unaff_retaddr_00;
  QWidget *in_stack_00000008;
  offset_in_QObject_to_subr in_stack_00000010;
  QWidget *w;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  WidgetAttribute in_stack_ffffffffffffffa4;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  bool local_21;
  Connection in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    local_21 = false;
    goto LAB_004276a8;
  }
  pQVar3 = qobject_cast<QWidget_const*>
                     ((QObject *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (pQVar3 != (QWidget *)0x0) {
    bVar2 = QWidget::testAttribute
                      ((QWidget *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                       in_stack_ffffffffffffffa4);
    if (bVar2) {
      local_21 = true;
      goto LAB_004276a8;
    }
    bVar2 = unstylable((QWidget *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (bVar2) {
      local_21 = false;
      goto LAB_004276a8;
    }
    QWidget::setAttribute(in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
  }
  QObject::connect<void(QObject::*)(QObject*),void(QStyleSheetStyleCaches::*)(QObject*)>
            ((Object *)in_stack_fffffffffffffff0.d_ptr,in_stack_00000010,(ContextType *)0x0,
             (offset_in_QStyleSheetStyleCaches_to_subr *)QStyleSheetStyleCaches::objectDestroyed,
             (ConnectionType)obj);
  QMetaObject::Connection::~Connection((Connection *)&stack0xfffffffffffffff0);
  local_21 = true;
LAB_004276a8:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QStyleSheetStyle::initObject(const QObject *obj) const
{
    if (!obj)
        return false;
    if (const QWidget *w = qobject_cast<const QWidget*>(obj)) {
        if (w->testAttribute(Qt::WA_StyleSheet))
            return true;
        if (unstylable(w))
            return false;
        const_cast<QWidget *>(w)->setAttribute(Qt::WA_StyleSheet, true);
    }

    connect(obj, &QObject::destroyed,
            styleSheetCaches, &QStyleSheetStyleCaches::objectDestroyed,
            Qt::UniqueConnection);
    return true;
}